

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

size_t __thiscall
notch::io::PlainTextNetworkReader::read_header
          (PlainTextNetworkReader *this,istream *in,MakeNet *mknet)

{
  bool bVar1;
  runtime_error *prVar2;
  allocator local_81;
  string local_80;
  float fmtVersion;
  size_t nLayers;
  size_t inputDim;
  string netTag;
  size_t outputDim;
  
  netTag._M_dataplus._M_p = (pointer)&netTag.field_2;
  netTag._M_string_length = 0;
  netTag.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_80,"net:",&local_81);
  read_tag_value<std::__cxx11::string>(this,in,&local_80,&netTag);
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &netTag,"Net");
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                   "unsupported network type: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&netTag);
    std::runtime_error::runtime_error(prVar2,(string *)&local_80);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_80,"format:",&local_81);
  read_tag_value<float>(this,in,&local_80,&fmtVersion);
  std::__cxx11::string::~string((string *)&local_80);
  if ((fmtVersion == 1.0) && (!NAN(fmtVersion))) {
    std::__cxx11::string::string((string *)&local_80,"inputs:",&local_81);
    read_tag_value<unsigned_long>(this,in,&local_80,&inputDim);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,"outputs:",&local_81);
    read_tag_value<unsigned_long>(this,in,&local_80,&outputDim);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string((string *)&local_80,"layers:",&local_81);
    read_tag_value<unsigned_long>(this,in,&local_80,&nLayers);
    std::__cxx11::string::~string((string *)&local_80);
    consume_end_of_record(this,in);
    core::MakeNet::setInputDim(mknet,inputDim);
    std::__cxx11::string::~string((string *)&netTag);
    return nLayers;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"unsupported version network format");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t read_header(std::istream &in, MakeNet &mknet) {
        std::string netTag;
        float fmtVersion;
        size_t inputDim;
        size_t outputDim;
        size_t nLayers;
        read_tag_value<std::string>(in, "net:", netTag);
        if (netTag != "Net") {
            throw std::runtime_error("unsupported network type: " + netTag);
        }
        read_tag_value<float>(in, "format:", fmtVersion);
        if (fmtVersion != 1.0) {
            throw std::runtime_error("unsupported version network format");
        }
        read_tag_value<size_t>(in, "inputs:", inputDim);
        read_tag_value<size_t>(in, "outputs:", outputDim); // ignore
        read_tag_value<size_t>(in, "layers:", nLayers);
        consume_end_of_record(in);
        mknet.setInputDim(inputDim);
        return nLayers;
    }